

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateEdit::QDateEdit(QDateEdit *this,QDate date,QWidget *parent)

{
  long lVar1;
  bool bVar2;
  QDateTimeEdit *in_RDX;
  QDate *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  ConnectionType unaff_retaddr;
  QDate *in_stack_ffffffffffffff80;
  Connection *this_00;
  undefined8 in_stack_ffffffffffffff90;
  Type parserType;
  QVariant *in_stack_ffffffffffffff98;
  Connection in_stack_ffffffffffffffc0;
  QDate local_38;
  QDate *local_30;
  undefined8 in_stack_ffffffffffffffe0;
  
  parserType = (Type)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = in_RSI;
  bVar2 = QDate::isValid(in_stack_ffffffffffffff80);
  if (bVar2) {
    local_38.jd = (qint64)local_30;
  }
  else {
    QDate::QDate(&local_38,2000,1,1);
  }
  ::QVariant::QVariant((QVariant *)&stack0xffffffffffffffd8,(QDate *)local_38.jd);
  QDateTimeEdit::QDateTimeEdit(in_RDX,in_stack_ffffffffffffff98,parserType,in_RDI);
  ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
  *(undefined ***)in_RDI = &PTR_metaObject_00d12108;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QDateEdit_00d122f8;
  this_00 = (Connection *)&stack0xffffffffffffffc0;
  QObject::connect<void(QDateTimeEdit::*)(QDate),void(QDateEdit::*)(QDate)>
            ((Object *)in_stack_ffffffffffffffc0.d_ptr,in_stack_ffffffffffffffe0,(ContextType *)0x0,
             (offset_in_QDateEdit_to_subr *)userDateChanged,unaff_retaddr);
  QMetaObject::Connection::~Connection(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDateEdit::QDateEdit(QDate date, QWidget *parent)
    : QDateTimeEdit(date.isValid() ? date : QDATETIMEEDIT_DATE_INITIAL, QMetaType::QDate, parent)
{
    connect(this, &QDateEdit::dateChanged, this, &QDateEdit::userDateChanged);
}